

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall
cmGeneratorTarget::GetFileSuffixInternal
          (cmGeneratorTarget *this,ArtifactType artifact,string *language)

{
  cmMakefile *pcVar1;
  TargetType TVar2;
  char *pcVar3;
  char *__lhs;
  ArtifactType artifact_00;
  string langSuffix;
  allocator<char> local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  TVar2 = GetType(this);
  if (TVar2 == STATIC_LIBRARY) {
LAB_0027ca3a:
    if (artifact == ImportLibraryArtifact) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&local_68);
      pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (pcVar3 == (char *)0x0) goto LAB_0027cba2;
    }
    TVar2 = GetType(this);
    artifact_00 = artifact;
    if (TVar2 != SHARED_LIBRARY) {
      TVar2 = GetType(this);
      if (TVar2 != MODULE_LIBRARY) {
        TVar2 = GetType(this);
        artifact_00 = RuntimeBinaryArtifact;
        if (TVar2 == EXECUTABLE) {
          artifact_00 = artifact;
        }
      }
    }
    if (artifact == ImportLibraryArtifact) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"IMPORT_SUFFIX",(allocator<char> *)&local_68);
      pcVar3 = GetProperty(this,&local_88);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"SUFFIX",(allocator<char> *)&local_68);
      pcVar3 = GetProperty(this,&local_88);
    }
    std::__cxx11::string::~string((string *)&local_88);
    if (pcVar3 == (char *)0x0) {
      __lhs = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
      pcVar3 = (char *)0x0;
      if ((__lhs != (char *)0x0) && (language->_M_string_length != 0)) {
        if (*__lhs == '\0') {
          pcVar3 = (char *)0x0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"_",&local_89);
          std::operator+(&local_68,__lhs,&local_48);
          std::operator+(&local_88,&local_68,language);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::~string((string *)&local_48);
          pcVar3 = cmMakefile::GetDefinition(this->Makefile,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
      }
      if (pcVar3 == (char *)0x0 && __lhs != (char *)0x0) {
        pcVar1 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,__lhs,(allocator<char> *)&local_68);
        pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
  }
  else {
    TVar2 = GetType(this);
    if (TVar2 == SHARED_LIBRARY) goto LAB_0027ca3a;
    TVar2 = GetType(this);
    if (TVar2 == MODULE_LIBRARY) goto LAB_0027ca3a;
    TVar2 = GetType(this);
    if (TVar2 == EXECUTABLE) goto LAB_0027ca3a;
LAB_0027cba2:
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char* cmGeneratorTarget::GetFileSuffixInternal(
  cmStateEnums::ArtifactType artifact, const std::string& language) const
{
  // no suffix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty suffix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute suffix value.
  const char* targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));

  if (!targetSuffix) {
    const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);
    if (!language.empty() && suffixVar && *suffixVar) {
      std::string langSuffix = suffixVar + std::string("_") + language;
      targetSuffix = this->Makefile->GetDefinition(langSuffix);
    }

    // if there is no suffix on the target nor specific language
    // use the cmake definition.
    if (!targetSuffix && suffixVar) {
      targetSuffix = this->Makefile->GetDefinition(suffixVar);
    }
  }

  return targetSuffix;
}